

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
ConsiderMarkingArguments<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *con,int i
          ,ExpressionAcceptanceLevel eal)

{
  bool bVar1;
  int in_ECX;
  undefined4 in_EDX;
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  bool fMarkArgs;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar2;
  int iVar3;
  
  uVar2 = (uint)in_stack_ffffffffffffffe4;
  bVar1 = BasicConstraint::HasResultVar((BasicConstraint *)in_RSI);
  if (bVar1) {
    iVar3 = CONCAT13(in_ECX == 0,(int3)uVar2);
  }
  else {
    iVar3 = CONCAT13(1,(int3)uVar2);
  }
  if ((char)((uint)iVar3 >> 0x18) != '\0') {
    DoMarkArgsAsVars<mp::AlgebraicExpression<mp::QuadAndLinTerms>>
              (in_RSI,(ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *)
                      CONCAT44(in_EDX,in_ECX),iVar3);
  }
  return;
}

Assistant:

void ConsiderMarkingArguments(
      const Con& con, int i, ExpressionAcceptanceLevel eal) {
    bool fMarkArgs = false;
    if (con.HasResultVar())    // func cons: those not accepted as expr
      fMarkArgs = (ExpressionAcceptanceLevel::NotAccepted==eal);
    else
      fMarkArgs = true;        // static cons: all non-algebraic by default
    if (fMarkArgs)
      MPD( DoMarkArgsAsVars(con, i) );
  }